

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeWeakMapConstructor
               (DynamicObject *weakMapConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  Var value;
  DynamicObject **ppDVar1;
  PropertyString *value_00;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *weakMapConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakMapConstructor,mode,3,0);
  this = RecyclableObject::GetLibrary(&weakMapConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetScriptContext(&weakMapConstructor->super_RecyclableObject);
  value = TaggedInt::ToVarUnchecked(0);
  AddMember(this,weakMapConstructor,0xd1,value,'\x02');
  ppDVar1 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).weakMapPrototype);
  AddMember(this,weakMapConstructor,0x124,*ppDVar1,'\0');
  value_00 = ScriptContext::GetPropertyString(this_00,400);
  AddMember(this,weakMapConstructor,0x106,value_00,'\x02');
  DynamicObject::SetHasNoEnumerableProperties(weakMapConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakMapConstructor(DynamicObject* weakMapConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakMapConstructor, mode, 3);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakMap
        // so that the update is in sync with profiler
        JavascriptLibrary* library = weakMapConstructor->GetLibrary();
        ScriptContext* scriptContext = weakMapConstructor->GetScriptContext();
        library->AddMember(weakMapConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(weakMapConstructor, PropertyIds::prototype, library->weakMapPrototype, PropertyNone);
        library->AddMember(weakMapConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::WeakMap), PropertyConfigurable);

        weakMapConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }